

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::MessageFieldGenerator::GenerateMembers
          (MessageFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  FieldDescriptor *pFVar1;
  FieldDescriptor *local_30;
  _func_void_FieldDescriptor_ptr *local_28;
  
  variables = &(this->super_FieldGeneratorBase).variables_;
  io::Printer::Print(printer,variables,"private $type_name$ $name$_;\n");
  WritePropertyDocComment(printer,(this->super_FieldGeneratorBase).descriptor_);
  FieldGeneratorBase::AddPublicMemberAttributes(&this->super_FieldGeneratorBase,printer);
  io::Printer::Print(printer,variables,
                     "$access_level$ $type_name$ $property_name$ {\n  get { return $name$_; }\n  set {\n    $name$_ = value;\n  }\n}\n"
                    );
  pFVar1 = (this->super_FieldGeneratorBase).descriptor_;
  if ((~(byte)pFVar1[1] & 0x60) != 0) {
    if (*(once_flag **)(pFVar1 + 0x18) != (once_flag *)0x0) {
      local_28 = FieldDescriptor::TypeOnceInit;
      local_30 = pFVar1;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar1 + 0x18),&local_28,&local_30);
    }
    if ((pFVar1[2] != (FieldDescriptor)0xb) &&
       ((*(char *)(*(long *)(pFVar1 + 0x10) + 0x3a) == '\x02' || (((byte)pFVar1[1] & 2) != 0)))) {
      io::Printer::Print(printer,variables,
                         "/// <summary>Gets whether the $descriptor_name$ field is set</summary>\n")
      ;
      FieldGeneratorBase::AddPublicMemberAttributes(&this->super_FieldGeneratorBase,printer);
      io::Printer::Print(printer,variables,
                         "$access_level$ bool Has$property_name$ {\n  get { return $name$_ != null; }\n}\n"
                        );
      io::Printer::Print(printer,variables,
                         "/// <summary>Clears the value of the $descriptor_name$ field</summary>\n")
      ;
      FieldGeneratorBase::AddPublicMemberAttributes(&this->super_FieldGeneratorBase,printer);
      io::Printer::Print(printer,variables,
                         "$access_level$ void Clear$property_name$() {\n  $name$_ = null;\n}\n");
    }
  }
  return;
}

Assistant:

void MessageFieldGenerator::GenerateMembers(io::Printer* printer) {
  printer->Print(
    variables_,
    "private $type_name$ $name$_;\n");
  WritePropertyDocComment(printer, descriptor_);
  AddPublicMemberAttributes(printer);
  printer->Print(
    variables_,
    "$access_level$ $type_name$ $property_name$ {\n"
    "  get { return $name$_; }\n"
    "  set {\n"
    "    $name$_ = value;\n"
    "  }\n"
    "}\n");
  if (SupportsPresenceApi(descriptor_)) {
    printer->Print(
      variables_,
      "/// <summary>Gets whether the $descriptor_name$ field is set</summary>\n");
    AddPublicMemberAttributes(printer);
    printer->Print(
      variables_,
      "$access_level$ bool Has$property_name$ {\n"
      "  get { return $name$_ != null; }\n"
      "}\n");
    printer->Print(
      variables_,
      "/// <summary>Clears the value of the $descriptor_name$ field</summary>\n");
    AddPublicMemberAttributes(printer);
    printer->Print(
      variables_,
      "$access_level$ void Clear$property_name$() {\n"
      "  $name$_ = null;\n"
      "}\n");
  }
}